

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_s128_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint w;
  int iVar1;
  uint i;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  word128 cval [4];
  
  iVar1 = 4;
  cval[0][0] = c->w64[0];
  cval[0][1] = c->w64[1];
  cval[1][0] = c->w64[2];
  cval[1][1] = c->w64[3];
  cval[2][0] = 0;
  cval[2][1] = 0;
  cval[3][0] = 0;
  cval[3][1] = 0;
  do {
    iVar2 = 0x40;
    do {
      auVar4 = vpbroadcastq_avx512vl();
      lVar3 = 0;
      do {
        auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar4,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar3),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar3) = auVar5;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x20);
      auVar4 = vpbroadcastq_avx512vl();
      lVar3 = 0x20;
      auVar4 = vpsllq_avx(auVar4,0x3e);
      auVar4 = vpsraq_avx512vl(auVar4,0x3f);
      do {
        auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar4,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar3),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar3) = auVar5;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x40);
      A = A + 2;
      iVar2 = iVar2 + -2;
    } while (iVar2 != 0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  *(uint *)c->w64 = (uint)cval[2][0] ^ (uint)cval[0][0];
  *(uint *)((long)c->w64 + 4) = cval[2][0]._4_4_ ^ cval[0][0]._4_4_;
  *(uint *)(c->w64 + 1) = (uint)cval[2][1] ^ (uint)cval[0][1];
  *(uint *)((long)c->w64 + 0xc) = cval[2][1]._4_4_ ^ cval[0][1]._4_4_;
  *(uint *)(c->w64 + 2) = (uint)cval[3][0] ^ (uint)cval[1][0];
  *(uint *)((long)c->w64 + 0x14) = cval[3][0]._4_4_ ^ cval[1][0]._4_4_;
  *(uint *)(c->w64 + 3) = (uint)cval[3][1] ^ (uint)cval[1][1];
  *(uint *)((long)c->w64 + 0x1c) = cval[3][1]._4_4_ ^ cval[1][1]._4_4_;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(&cblock->w64[0]), mm128_load(&cblock->w64[2]), mm128_zero,
                     mm128_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 2) {
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mm128_compute_mask(idx, 1), 2);
    }
  }
  mm128_store(&cblock->w64[0], mm128_xor(cval[0], cval[2]));
  mm128_store(&cblock->w64[2], mm128_xor(cval[1], cval[3]));
}